

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  uint uVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  int iVar6;
  ImGuiWindow *pIVar7;
  ImGuiKeyData *pIVar8;
  byte *in_RCX;
  long in_RDX;
  ImGuiID in_ESI;
  uint in_R8D;
  ImVec2 IVar9;
  bool is_button_avail_or_owned;
  bool is_repeating_already;
  bool is_double_click_release;
  bool release_anywhere;
  bool release_in;
  int mouse_button;
  bool held;
  float t1;
  ImGuiKeyData *key2;
  ImGuiKeyData *key1;
  bool nav_activated_by_inputs;
  bool nav_activated_by_code;
  bool has_repeated_at_least_once;
  int mouse_button_released;
  int mouse_button_clicked;
  ImGuiID test_owner_id;
  bool hovered;
  bool pressed;
  bool flatten_hovered_children;
  ImGuiWindow *backup_hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff68;
  ImGuiID in_stack_ffffffffffffff70;
  bool bVar12;
  ImGuiKey in_stack_ffffffffffffff74;
  ImGuiKey IVar10;
  uint uVar11;
  ImGuiID IVar13;
  ushort uVar14;
  char cVar15;
  undefined4 in_stack_ffffffffffffff7c;
  undefined1 uVar16;
  ImGuiID in_stack_ffffffffffffff80;
  ImGuiKey in_stack_ffffffffffffff84;
  ImGuiWindow *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  byte bVar17;
  float in_stack_ffffffffffffff94;
  ImGuiWindow *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  ImGuiID id_00;
  int local_50;
  int local_4c;
  bool local_43;
  uint local_24;
  ImGuiID owner_id;
  
  pIVar4 = GImGui;
  id_00 = (ImGuiID)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  pIVar7 = GetCurrentWindow();
  local_24 = in_R8D;
  if ((in_R8D & 7) == 0) {
    local_24 = in_R8D | 1;
  }
  if ((local_24 & 0x3f0) == 0) {
    local_24 = local_24 | 0x20;
  }
  pIVar1 = pIVar4->HoveredWindow;
  uVar16 = (undefined1)((uint)in_stack_ffffffffffffff7c >> 0x18);
  uVar14 = (ushort)in_stack_ffffffffffffff7c;
  owner_id = CONCAT13(uVar16,(uint3)uVar14);
  if (((local_24 & 0x800) != 0) &&
     (owner_id = CONCAT13(uVar16,(uint3)uVar14), pIVar4->HoveredWindow != (ImGuiWindow *)0x0)) {
    owner_id = CONCAT13(uVar16,CONCAT12(pIVar4->HoveredWindow->RootWindow == pIVar7,uVar14));
  }
  cVar15 = (char)(owner_id >> 0x10);
  if (cVar15 != '\0') {
    pIVar4->HoveredWindow = pIVar7;
  }
  bVar2 = false;
  local_43 = ItemHoverable((ImRect *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  if ((((local_43) && ((pIVar4->DragDropActive & 1U) != 0)) &&
      ((pIVar4->DragDropPayload).SourceId == in_ESI)) && ((pIVar4->DragDropSourceFlags & 2U) == 0))
  {
    local_43 = false;
  }
  if ((((pIVar4->DragDropActive & 1U) != 0) && ((local_24 & 0x200) != 0)) &&
     (((pIVar4->DragDropSourceFlags & 4U) == 0 &&
      (bVar5 = IsItemHovered(in_stack_ffffffffffffff80), bVar5)))) {
    local_43 = true;
    SetHoveredID(in_ESI);
    if ((pIVar4->HoveredIdTimer - (pIVar4->IO).DeltaTime <= 0.7) && (0.7 <= pIVar4->HoveredIdTimer))
    {
      bVar2 = true;
      pIVar4->DragDropHoldJustPressedId = in_ESI;
      FocusWindow((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
  }
  if (cVar15 != '\0') {
    pIVar4->HoveredWindow = pIVar1;
  }
  if ((((local_43 != false) && ((local_24 & 0x1000) != 0)) &&
      (pIVar4->HoveredIdPreviousFrame != in_ESI)) && (pIVar4->HoveredIdPreviousFrame != 0)) {
    local_43 = false;
  }
  IVar13 = in_ESI;
  if ((local_24 & 0x200000) != 0) {
    IVar13 = 0;
  }
  if (local_43 != false) {
    if (((local_24 & 0x10000) == 0) ||
       (((((pIVar4->IO).KeyCtrl & 1U) == 0 && (((pIVar4->IO).KeyShift & 1U) == 0)) &&
        (((pIVar4->IO).KeyAlt & 1U) == 0)))) {
      local_4c = -1;
      IVar10 = in_stack_ffffffffffffff74;
      if (((local_24 & 1) == 0) ||
         (bVar5 = IsMouseClicked(in_stack_ffffffffffffff80,owner_id,IVar13),
         IVar10 = in_stack_ffffffffffffff74, !bVar5)) {
        if (((local_24 & 2) == 0) ||
           (bVar5 = IsMouseClicked(in_stack_ffffffffffffff80,owner_id,IVar13), !bVar5)) {
          if (((local_24 & 4) != 0) &&
             (bVar5 = IsMouseClicked(in_stack_ffffffffffffff80,owner_id,IVar13), bVar5)) {
            local_4c = 2;
          }
        }
        else {
          local_4c = 1;
        }
      }
      else {
        local_4c = 0;
      }
      if ((local_4c != -1) && (pIVar4->ActiveId != in_ESI)) {
        if ((local_24 & 0x100000) == 0) {
          MouseButtonToKey(local_4c);
          SetKeyOwner(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,owner_id);
        }
        if ((local_24 & 0x60) != 0) {
          SetActiveID(id_00,in_stack_ffffffffffffff98);
          pIVar4->ActiveIdMouseButton = local_4c;
          if ((local_24 & 0x40000) == 0) {
            SetFocusID((ImGuiID)in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
          }
          FocusWindow((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
        if (((local_24 & 0x10) != 0) ||
           (((local_24 & 0x100) != 0 && ((pIVar4->IO).MouseClickedCount[local_4c] == 2)))) {
          bVar2 = true;
          if ((local_24 & 0x20000) == 0) {
            SetActiveID(id_00,in_stack_ffffffffffffff98);
          }
          else {
            ClearActiveID();
          }
          if ((local_24 & 0x40000) == 0) {
            SetFocusID((ImGuiID)in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
          }
          pIVar4->ActiveIdMouseButton = local_4c;
          FocusWindow((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
      }
      in_stack_ffffffffffffff74 = IVar10;
      if ((local_24 & 0x80) != 0) {
        local_50 = -1;
        if (((local_24 & 1) == 0) ||
           (bVar5 = IsMouseReleased(IVar10,in_stack_ffffffffffffff70), !bVar5)) {
          if (((local_24 & 2) == 0) ||
             (bVar5 = IsMouseReleased(IVar10,in_stack_ffffffffffffff70), !bVar5)) {
            if (((local_24 & 4) != 0) &&
               (bVar5 = IsMouseReleased(IVar10,in_stack_ffffffffffffff70), bVar5)) {
              local_50 = 2;
            }
          }
          else {
            local_50 = 1;
          }
        }
        else {
          local_50 = 0;
        }
        in_stack_ffffffffffffff74 = IVar10;
        if (local_50 != -1) {
          in_stack_ffffffffffffff74 = IVar10 & 0xffffff;
          if ((local_24 & 0x400) != 0) {
            in_stack_ffffffffffffff74 =
                 CONCAT13((pIVar4->IO).KeyRepeatDelay <=
                          (pIVar4->IO).MouseDownDurationPrev[local_50],(int3)IVar10);
          }
          if ((char)(in_stack_ffffffffffffff74 >> 0x18) == '\0') {
            bVar2 = true;
          }
          if ((local_24 & 0x40000) == 0) {
            SetFocusID((ImGuiID)in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
          }
          ClearActiveID();
        }
      }
      if ((((pIVar4->ActiveId == in_ESI) && ((local_24 & 0x400) != 0)) &&
          (0.0 < (pIVar4->IO).MouseDownDuration[pIVar4->ActiveIdMouseButton])) &&
         (bVar5 = IsMouseClicked(in_stack_ffffffffffffff80,owner_id,IVar13), bVar5)) {
        bVar2 = true;
      }
    }
    if (bVar2 != false) {
      pIVar4->NavDisableHighlight = true;
    }
  }
  if (((((pIVar4->NavId == in_ESI) && ((pIVar4->NavDisableHighlight & 1U) == 0)) &&
       ((pIVar4->NavDisableMouseHover & 1U) != 0)) &&
      (((pIVar4->ActiveId == 0 || (pIVar4->ActiveId == in_ESI)) ||
       (pIVar4->ActiveId == pIVar7->MoveId)))) && ((local_24 & 0x80000) == 0)) {
    local_43 = true;
  }
  if (pIVar4->NavActivateDownId == in_ESI) {
    IVar13 = pIVar4->NavActivateId;
    bVar5 = pIVar4->NavActivatePressedId == in_ESI;
    if ((!bVar5) && ((local_24 & 0x400) != 0)) {
      pIVar8 = GetKeyData(in_stack_ffffffffffffff74);
      in_stack_ffffffffffffff98 = (ImGuiWindow *)GetKeyData(in_stack_ffffffffffffff74);
      in_stack_ffffffffffffff94 =
           ImMax<float>(pIVar8->DownDuration,*(float *)((long)&in_stack_ffffffffffffff98->Name + 4))
      ;
      id_00 = (ImGuiID)((ulong)pIVar8 >> 0x20);
      iVar6 = CalcTypematicRepeatAmount
                        (in_stack_ffffffffffffff94 - (pIVar4->IO).DeltaTime,
                         in_stack_ffffffffffffff94,(pIVar4->IO).KeyRepeatDelay,
                         (pIVar4->IO).KeyRepeatRate);
      bVar5 = 0 < iVar6;
    }
    if ((IVar13 == in_ESI) || (bVar5)) {
      bVar2 = true;
      SetActiveID(id_00,in_stack_ffffffffffffff98);
      pIVar4->ActiveIdSource = ImGuiInputSource_Nav;
      if ((local_24 & 0x40000) == 0) {
        SetFocusID((ImGuiID)in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
      }
    }
  }
  bVar17 = 0;
  if (pIVar4->ActiveId == in_ESI) {
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      bVar17 = 0;
      if ((pIVar4->ActiveIdIsJustActivated & 1U) != 0) {
        bVar17 = 0;
        IVar9 = ::operator-(in_stack_ffffffffffffff68,(ImVec2 *)0x4ed042);
        pIVar4->ActiveIdClickOffset = IVar9;
      }
      iVar6 = pIVar4->ActiveIdMouseButton;
      bVar5 = IsMouseDown(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
      if (bVar5) {
        bVar17 = 1;
      }
      else {
        bVar12 = local_43 != false && (local_24 & 0x20) != 0;
        bVar5 = (local_24 & 0x40) != 0;
        if (((bVar12) || (bVar5)) && ((pIVar4->DragDropActive & 1U) == 0)) {
          uVar11 = 0;
          if (((local_24 & 0x100) != 0) &&
             (uVar11 = 0, ((pIVar4->IO).MouseReleased[iVar6] & 1U) != 0)) {
            uVar11 = (uint)((pIVar4->IO).MouseClickedLastCount[iVar6] == 2) << 8;
          }
          uVar3 = uVar11 >> 8;
          if ((local_24 & 0x400) != 0) {
            uVar11 = (uint)((pIVar4->IO).KeyRepeatDelay <= (pIVar4->IO).MouseDownDurationPrev[iVar6]
                           );
          }
          IVar10 = CONCAT31(CONCAT21(CONCAT11(bVar12,bVar5),(char)uVar3),(char)uVar11);
          MouseButtonToKey(iVar6);
          bVar5 = TestKeyOwner(IVar10,owner_id);
          if ((((IVar10 & 0x100) == ImGuiKey_KeysData_OFFSET) &&
              ((IVar10 & 1) == ImGuiKey_KeysData_OFFSET)) && (bVar5)) {
            bVar2 = true;
          }
        }
        ClearActiveID();
      }
      if ((local_24 & 0x40000) == 0) {
        pIVar4->NavDisableHighlight = true;
      }
    }
    else {
      bVar17 = 0;
      if ((pIVar4->ActiveIdSource == ImGuiInputSource_Nav) &&
         (bVar17 = 0, pIVar4->NavActivateDownId != in_ESI)) {
        bVar17 = 0;
        ClearActiveID();
      }
    }
    if (bVar2 != false) {
      pIVar4->ActiveIdHasBeenPressedBefore = true;
    }
  }
  if (in_RDX != 0) {
    *(bool *)in_RDX = local_43;
  }
  if (in_RCX != (byte *)0x0) {
    *in_RCX = bVar17 & 1;
  }
  return bVar2;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredWindow && g.HoveredWindow->RootWindow == window;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && g.LastItemData.ID != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (g.HoveredIdTimer - g.IO.DeltaTime <= DRAGDROP_HOLD_TO_OPEN_TIMER && g.HoveredIdTimer >= DRAGDROP_HOLD_TO_OPEN_TIMER)
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    const ImGuiID test_owner_id = (flags & ImGuiButtonFlags_NoTestKeyOwner) ? ImGuiKeyOwner_Any : id;
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && IsMouseClicked(0, test_owner_id))         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && IsMouseClicked(1, test_owner_id))   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && IsMouseClicked(2, test_owner_id))  { mouse_button_clicked = 2; }
            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (!(flags & ImGuiButtonFlags_NoSetKeyOwner))
                    SetKeyOwner(MouseButtonToKey(mouse_button_clicked), id);
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseClickedCount[mouse_button_clicked] == 2))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if (flags & ImGuiButtonFlags_PressedOnRelease)
            {
                int mouse_button_released = -1;
                if ((flags & ImGuiButtonFlags_MouseButtonLeft) && IsMouseReleased(0, test_owner_id))        { mouse_button_released = 0; }
                else if ((flags & ImGuiButtonFlags_MouseButtonRight) && IsMouseReleased(1, test_owner_id))  { mouse_button_released = 1; }
                else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && IsMouseReleased(2, test_owner_id)) { mouse_button_released = 2; }
                if (mouse_button_released != -1)
                {
                    const bool has_repeated_at_least_once = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay; // Repeat mode trumps on release behavior
                    if (!has_repeated_at_least_once)
                        pressed = true;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    ClearActiveID();
                }
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, test_owner_id, ImGuiInputFlags_Repeat))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = (g.NavActivatePressedId == id);
        if (!nav_activated_by_inputs && (flags & ImGuiButtonFlags_Repeat))
        {
            // Avoid pressing both keys from triggering double amount of repeat events
            const ImGuiKeyData* key1 = GetKeyData(ImGuiKey_Space);
            const ImGuiKeyData* key2 = GetKeyData(ImGuiKey_NavGamepadActivate);
            const float t1 = ImMax(key1->DownDuration, key2->DownDuration);
            nav_activated_by_inputs = CalcTypematicRepeatAmount(t1 - g.IO.DeltaTime, t1, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
        }
        if (nav_activated_by_code || nav_activated_by_inputs)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            pressed = true;
            SetActiveID(id, window);
            g.ActiveIdSource = ImGuiInputSource_Nav;
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    // Process while held
    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            if (IsMouseDown(mouse_button, test_owner_id))
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    // Report as pressed when releasing the mouse (this is the most common path)
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseReleased[mouse_button] && g.IO.MouseClickedLastCount[mouse_button] == 2;
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    bool is_button_avail_or_owned = TestKeyOwner(MouseButtonToKey(mouse_button), test_owner_id);
                    if (!is_double_click_release && !is_repeating_already && is_button_avail_or_owned)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            // When activated using Nav, we hold on the ActiveID until activation button is released
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}